

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant_impl.hpp
# Opt level: O3

variant_storage<type_safe::optional_variant_policy,_int,_double,_debugger_type> * __thiscall
type_safe::detail::variant_storage<type_safe::optional_variant_policy,_int,_double,_debugger_type>::
operator=(variant_storage<type_safe::optional_variant_policy,_int,_double,_debugger_type> *this,
         variant_storage<type_safe::optional_variant_policy,_int,_double,_debugger_type> *other)

{
  unsigned_long uVar1;
  undefined1 local_9;
  
  uVar1 = (other->storage_).cur_type_.
          super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
          .value_;
  if ((this->storage_).cur_type_.
      super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
      .value_ == 0) {
    if (uVar1 != 0) {
      copy<int,double,debugger_type>(&this->storage_,&other->storage_);
    }
  }
  else if (uVar1 == 0) {
    destroy_union<type_safe::tagged_union<int,_double,_debugger_type>_>::destroy(&this->storage_);
  }
  else {
    with_union<type_safe::detail::copy_assign_union_value<type_safe::optional_variant_policy,type_safe::tagged_union<int,double,debugger_type>>::visitor&&,type_safe::tagged_union<int,double,debugger_type>const&,type_safe::union_types<int,double,debugger_type>,type_safe::tagged_union<int,double,debugger_type>&>
    ::with_impl<int,double,debugger_type>(other,&local_9,this);
  }
  return this;
}

Assistant:

variant_storage& operator=(const variant_storage& other)
        {
            if (storage_.has_value() && other.storage_.has_value())
                copy_assign_union_value<VariantPolicy,
                                        tagged_union<Types...>>::assign(storage_, other.storage_);
            else if (storage_.has_value() && !other.storage_.has_value())
                destroy(storage_);
            else if (!storage_.has_value() && other.storage_.has_value())
                copy(storage_, other.storage_);

            return *this;
        }